

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O3

void fio_poll_add(intptr_t fd)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  int __fd;
  uint32_t local_2c;
  int local_28;
  
  iVar1 = evio_fd[1];
  piVar4 = __errno_location();
  do {
    do {
      while( true ) {
        *piVar4 = 0;
        local_2c = 0x40002011;
        __fd = (int)fd;
        local_28 = __fd;
        iVar2 = epoll_ctl(iVar1,3,__fd,(epoll_event *)&local_2c);
        iVar3 = *piVar4;
        if (iVar2 == -1) break;
        if (iVar3 != 4) goto LAB_0013b29c;
      }
    } while (iVar3 == 4);
    if (iVar3 != 2) {
      return;
    }
    *piVar4 = 0;
    local_2c = 0x40002011;
    local_28 = __fd;
    iVar3 = epoll_ctl(iVar1,1,__fd,(epoll_event *)&local_2c);
  } while (*piVar4 == 4);
  if (iVar3 != -1) {
LAB_0013b29c:
    iVar1 = evio_fd[2];
    do {
      *piVar4 = 0;
      local_2c = 0x40002014;
      local_28 = __fd;
      iVar3 = epoll_ctl(iVar1,3,__fd,(epoll_event *)&local_2c);
      if (iVar3 == -1) {
        iVar3 = *piVar4;
        if (iVar3 == 2) {
          *piVar4 = 0;
          local_2c = 0x40002014;
          local_28 = __fd;
          epoll_ctl(iVar1,1,__fd,(epoll_event *)&local_2c);
          goto LAB_0013b2fc;
        }
      }
      else {
LAB_0013b2fc:
        iVar3 = *piVar4;
      }
    } while (iVar3 == 4);
  }
  return;
}

Assistant:

static inline void fio_poll_add(intptr_t fd) {
  if (fio_poll_add2(fd, (EPOLLIN | EPOLLRDHUP | EPOLLHUP | EPOLLONESHOT),
                    evio_fd[1]) == -1)
    return;
  fio_poll_add2(fd, (EPOLLOUT | EPOLLRDHUP | EPOLLHUP | EPOLLONESHOT),
                evio_fd[2]);
  return;
}